

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

UpsampleLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_upsample(NeuralNetworkLayer *this)

{
  bool bVar1;
  UpsampleLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_upsample(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_upsample(this);
    this_00 = (UpsampleLayerParams *)operator_new(0x48);
    UpsampleLayerParams::UpsampleLayerParams(this_00);
    (this->layer_).upsample_ = this_00;
  }
  return (UpsampleLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::UpsampleLayerParams* NeuralNetworkLayer::mutable_upsample() {
  if (!has_upsample()) {
    clear_layer();
    set_has_upsample();
    layer_.upsample_ = new ::CoreML::Specification::UpsampleLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.upsample)
  return layer_.upsample_;
}